

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void stbi__idct_simd(stbi_uc *out,int out_stride,short *data)

{
  stbi_uc *psVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  uint6 uVar64;
  uint6 uVar65;
  undefined1 auVar66 [12];
  undefined1 auVar67 [12];
  undefined1 auVar68 [12];
  undefined1 auVar69 [12];
  long lVar70;
  long lVar71;
  undefined1 auVar72 [12];
  int iVar73;
  int iVar74;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  undefined1 auVar75 [16];
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar88;
  int iVar89;
  int iVar90;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  int iVar91;
  int iVar95;
  short sVar96;
  int iVar97;
  undefined1 auVar92 [16];
  int iVar98;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined2 uVar103;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  int iVar104;
  int iVar105;
  int iVar114;
  undefined1 auVar106 [12];
  int iVar115;
  int iVar116;
  int iVar117;
  int iVar118;
  int iVar119;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  int iVar120;
  int iVar127;
  int iVar129;
  undefined1 auVar122 [16];
  int iVar121;
  int iVar128;
  int iVar130;
  int iVar131;
  int iVar132;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  int iVar137;
  int iVar141;
  int iVar142;
  int iVar143;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  int iVar144;
  int iVar150;
  int iVar151;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  int iVar152;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar153 [12];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  int iVar172;
  int iVar181;
  int iVar183;
  undefined1 auVar173 [16];
  undefined1 auVar177 [16];
  int iVar184;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  short sVar182;
  undefined1 auVar180 [16];
  undefined1 auVar185 [12];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar191 [16];
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  int local_18;
  int iStack_14;
  int iStack_10;
  int iStack_c;
  undefined1 auVar107 [16];
  undefined1 auVar156 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar190 [16];
  
  auVar122 = *(undefined1 (*) [16])(data + 0x10);
  auVar146 = *(undefined1 (*) [16])(data + 0x28);
  auVar155 = *(undefined1 (*) [16])(data + 0x38);
  auVar161._0_12_ = auVar122._0_12_;
  auVar161._12_2_ = auVar122._6_2_;
  auVar161._14_2_ = data[0x33];
  auVar160._12_4_ = auVar161._12_4_;
  auVar160._0_10_ = auVar122._0_10_;
  auVar160._10_2_ = data[0x32];
  auVar159._10_6_ = auVar160._10_6_;
  auVar159._0_8_ = auVar122._0_8_;
  auVar159._8_2_ = auVar122._4_2_;
  auVar158._8_8_ = auVar159._8_8_;
  auVar158._6_2_ = data[0x31];
  auVar158._4_2_ = auVar122._2_2_;
  auVar158._0_2_ = auVar122._0_2_;
  auVar158._2_2_ = data[0x30];
  auVar186._2_2_ = data[0x34];
  auVar186._0_2_ = auVar122._8_2_;
  auVar186._4_2_ = auVar122._10_2_;
  auVar186._6_2_ = data[0x35];
  auVar186._8_2_ = auVar122._12_2_;
  auVar186._10_2_ = data[0x36];
  auVar186._12_2_ = auVar122._14_2_;
  auVar186._14_2_ = data[0x37];
  auVar66._10_2_ = data[0x22] + data[2];
  auVar66._0_10_ = (unkuint10)0;
  uVar64 = CONCAT24(data[0x25] + data[5],(uint)(ushort)(data[0x24] + data[4]));
  auVar106._0_10_ = (unkuint10)uVar64 << 0x10;
  auVar106._10_2_ = data[0x26] + data[6];
  auVar107._12_2_ = 0;
  auVar107._0_12_ = auVar106;
  auVar107._14_2_ = data[0x27] + data[7];
  auVar67._10_2_ = data[2] - data[0x22];
  auVar67._0_10_ = (unkuint10)0;
  uVar65 = CONCAT24(data[5] - data[0x25],(uint)(ushort)(data[4] - data[0x24]));
  auVar72._0_10_ = (unkuint10)uVar65 << 0x10;
  auVar72._10_2_ = data[6] - data[0x26];
  auVar87._12_2_ = 0;
  auVar87._0_12_ = auVar72;
  auVar87._14_2_ = data[7] - data[0x27];
  auVar176._0_12_ = auVar155._0_12_;
  auVar176._12_2_ = auVar155._6_2_;
  auVar176._14_2_ = data[0x1b];
  auVar175._12_4_ = auVar176._12_4_;
  auVar175._0_10_ = auVar155._0_10_;
  auVar175._10_2_ = data[0x1a];
  auVar174._10_6_ = auVar175._10_6_;
  auVar174._0_8_ = auVar155._0_8_;
  auVar174._8_2_ = auVar155._4_2_;
  auVar173._8_8_ = auVar174._8_8_;
  auVar173._6_2_ = data[0x19];
  auVar173._4_2_ = auVar155._2_2_;
  auVar173._0_2_ = auVar155._0_2_;
  auVar173._2_2_ = data[0x18];
  auVar154._2_2_ = data[0x1c];
  auVar154._0_2_ = auVar155._8_2_;
  auVar154._4_2_ = auVar155._10_2_;
  auVar154._6_2_ = data[0x1d];
  auVar154._8_2_ = auVar155._12_2_;
  auVar154._10_2_ = data[0x1e];
  auVar154._12_2_ = auVar155._14_2_;
  auVar154._14_2_ = data[0x1f];
  auVar177 = pmaddwd(auVar173,_DAT_001b8530);
  auVar136._0_12_ = auVar146._0_12_;
  auVar136._12_2_ = auVar146._6_2_;
  auVar136._14_2_ = data[0xb];
  auVar148._12_4_ = auVar136._12_4_;
  auVar148._0_10_ = auVar146._0_10_;
  auVar148._10_2_ = data[10];
  auVar139._10_6_ = auVar148._10_6_;
  auVar139._0_8_ = auVar146._0_8_;
  auVar139._8_2_ = auVar146._4_2_;
  auVar140._8_8_ = auVar139._8_8_;
  auVar140._6_2_ = data[9];
  auVar140._4_2_ = auVar146._2_2_;
  auVar140._0_2_ = auVar146._0_2_;
  auVar140._2_2_ = data[8];
  auVar133._2_2_ = data[0xc];
  auVar133._0_2_ = auVar146._8_2_;
  auVar133._4_2_ = auVar146._10_2_;
  auVar133._6_2_ = data[0xd];
  auVar133._8_2_ = auVar146._12_2_;
  auVar133._10_2_ = data[0xe];
  auVar133._12_2_ = auVar146._14_2_;
  auVar133._14_2_ = data[0xf];
  sVar96 = auVar155._6_2_ + data[0xb];
  auVar145._8_8_ =
       (undefined8)
       (CONCAT64(CONCAT42(CONCAT22(auVar146._6_2_ + data[0x1b],sVar96),auVar146._4_2_ + data[0x1a]),
                 CONCAT22(auVar155._4_2_ + data[10],sVar96)) >> 0x10);
  auVar145._6_2_ = auVar146._2_2_ + data[0x19];
  auVar145._4_2_ = auVar155._2_2_ + data[9];
  auVar145._2_2_ = auVar140._0_2_ + data[0x18];
  auVar145._0_2_ = auVar173._0_2_ + data[8];
  auVar92._2_2_ = auVar146._8_2_ + data[0x1c];
  auVar92._0_2_ = auVar155._8_2_ + data[0xc];
  auVar92._4_2_ = auVar155._10_2_ + data[0xd];
  auVar92._6_2_ = auVar146._10_2_ + data[0x1d];
  auVar92._8_2_ = auVar155._12_2_ + data[0xe];
  auVar92._10_2_ = auVar146._12_2_ + data[0x1e];
  auVar92._12_2_ = auVar155._14_2_ + data[0xf];
  auVar92._14_2_ = auVar146._14_2_ + data[0x1f];
  auVar122 = pmaddwd(auVar140,_DAT_001b8540);
  auVar146 = pmaddwd(auVar145,_DAT_001b8570);
  iVar120 = auVar122._0_4_ + auVar146._0_4_;
  iVar127 = auVar122._4_4_ + auVar146._4_4_;
  iVar129 = auVar122._8_4_ + auVar146._8_4_;
  iVar131 = auVar122._12_4_ + auVar146._12_4_;
  iVar144 = auVar146._0_4_ + auVar177._0_4_;
  iVar150 = auVar146._4_4_ + auVar177._4_4_;
  iVar151 = auVar146._8_4_ + auVar177._8_4_;
  iVar152 = auVar146._12_4_ + auVar177._12_4_;
  auVar155 = pmaddwd(auVar154,_DAT_001b8530);
  auVar146 = pmaddwd(auVar133,_DAT_001b8540);
  auVar122 = pmaddwd(auVar92,_DAT_001b8570);
  iVar121 = auVar146._0_4_ + auVar122._0_4_;
  iVar128 = auVar146._4_4_ + auVar122._4_4_;
  iVar130 = auVar146._8_4_ + auVar122._8_4_;
  iVar132 = auVar146._12_4_ + auVar122._12_4_;
  iVar91 = auVar122._0_4_ + auVar155._0_4_;
  iVar95 = auVar122._4_4_ + auVar155._4_4_;
  iVar97 = auVar122._8_4_ + auVar155._8_4_;
  iVar98 = auVar122._12_4_ + auVar155._12_4_;
  auVar155 = pmaddwd(auVar173,_DAT_001b8520);
  auVar122 = pmaddwd(auVar140,_DAT_001b8550);
  auVar146 = pmaddwd(auVar145,_DAT_001b8560);
  iVar172 = auVar155._0_4_ + auVar146._0_4_;
  iVar181 = auVar155._4_4_ + auVar146._4_4_;
  iVar183 = auVar155._8_4_ + auVar146._8_4_;
  iVar184 = auVar155._12_4_ + auVar146._12_4_;
  iVar137 = auVar146._0_4_ + auVar122._0_4_;
  iVar141 = auVar146._4_4_ + auVar122._4_4_;
  iVar142 = auVar146._8_4_ + auVar122._8_4_;
  iVar143 = auVar146._12_4_ + auVar122._12_4_;
  auVar122 = pmaddwd(auVar154,_DAT_001b8520);
  auVar155 = pmaddwd(auVar133,_DAT_001b8550);
  auVar146 = pmaddwd(auVar92,_DAT_001b8560);
  iVar81 = auVar122._0_4_ + auVar146._0_4_;
  iVar82 = auVar122._4_4_ + auVar146._4_4_;
  iVar83 = auVar122._8_4_ + auVar146._8_4_;
  iVar84 = auVar122._12_4_ + auVar146._12_4_;
  iVar85 = auVar146._0_4_ + auVar155._0_4_;
  iVar88 = auVar146._4_4_ + auVar155._4_4_;
  iVar89 = auVar146._8_4_ + auVar155._8_4_;
  iVar90 = auVar146._12_4_ + auVar155._12_4_;
  auVar122 = pmaddwd(auVar158,_DAT_001b8510);
  iVar73 = (int)((uint)(ushort)(data[0x20] + *data) << 0x10) >> 4;
  iVar76 = SUB164(ZEXT616(CONCAT42(auVar66._8_4_,data[0x21] + data[1])) << 0x30,4) >> 4;
  iVar78 = auVar66._8_4_ >> 4;
  iVar74 = iVar73 + 0x200 + auVar122._0_4_;
  iVar77 = iVar76 + 0x200 + auVar122._4_4_;
  iVar79 = iVar78 + 0x200 + auVar122._8_4_;
  iVar80 = auVar122._12_4_ + 0x200;
  auVar187 = pmaddwd(auVar186,_DAT_001b8510);
  iVar104 = (int)auVar106._0_10_ >> 4;
  iVar114 = (int)((int6)uVar64 >> 0x14);
  iVar116 = auVar106._8_4_ >> 4;
  iVar118 = auVar107._12_4_ >> 4;
  iVar105 = iVar104 + 0x200 + auVar187._0_4_;
  iVar115 = iVar114 + 0x200 + auVar187._4_4_;
  iVar117 = iVar116 + 0x200 + auVar187._8_4_;
  iVar119 = iVar118 + 0x200 + auVar187._12_4_;
  auVar178._0_4_ = iVar137 + iVar74 >> 10;
  auVar178._4_4_ = iVar141 + iVar77 >> 10;
  auVar178._8_4_ = iVar142 + iVar79 >> 10;
  auVar178._12_4_ = iVar143 + iVar80 >> 10;
  auVar134._0_4_ = iVar85 + iVar105 >> 10;
  auVar134._4_4_ = iVar88 + iVar115 >> 10;
  auVar134._8_4_ = iVar89 + iVar117 >> 10;
  auVar134._12_4_ = iVar90 + iVar119 >> 10;
  auVar179 = packssdw(auVar178,auVar134);
  auVar100._0_4_ = iVar74 - iVar137 >> 10;
  auVar100._4_4_ = iVar77 - iVar141 >> 10;
  auVar100._8_4_ = iVar79 - iVar142 >> 10;
  auVar100._12_4_ = iVar80 - iVar143 >> 10;
  auVar108._0_4_ = iVar105 - iVar85 >> 10;
  auVar108._4_4_ = iVar115 - iVar88 >> 10;
  auVar108._8_4_ = iVar117 - iVar89 >> 10;
  auVar108._12_4_ = iVar119 - iVar90 >> 10;
  auVar75 = packssdw(auVar100,auVar108);
  auVar177 = pmaddwd(auVar158,_DAT_001b8500);
  iVar105 = (int)((uint)(ushort)(*data - data[0x20]) << 0x10) >> 4;
  iVar117 = SUB164(ZEXT616(CONCAT42(auVar67._8_4_,data[1] - data[0x21])) << 0x30,4) >> 4;
  iVar137 = auVar67._8_4_ >> 4;
  iVar115 = iVar105 + 0x200 + auVar177._0_4_;
  iVar119 = iVar117 + 0x200 + auVar177._4_4_;
  iVar141 = iVar137 + 0x200 + auVar177._8_4_;
  iVar142 = auVar177._12_4_ + 0x200;
  auVar146 = pmaddwd(auVar186,_DAT_001b8500);
  iVar74 = (int)auVar72._0_10_ >> 4;
  iVar79 = (int)((int6)uVar65 >> 0x14);
  iVar85 = auVar72._8_4_ >> 4;
  iVar89 = auVar87._12_4_ >> 4;
  iVar77 = iVar74 + 0x200 + auVar146._0_4_;
  iVar80 = iVar79 + 0x200 + auVar146._4_4_;
  iVar88 = iVar85 + 0x200 + auVar146._8_4_;
  iVar90 = iVar89 + 0x200 + auVar146._12_4_;
  auVar188._0_4_ = iVar144 + iVar115 >> 10;
  auVar188._4_4_ = iVar150 + iVar119 >> 10;
  auVar188._8_4_ = iVar151 + iVar141 >> 10;
  auVar188._12_4_ = iVar152 + iVar142 >> 10;
  auVar189._0_4_ = iVar91 + iVar77 >> 10;
  auVar189._4_4_ = iVar95 + iVar80 >> 10;
  auVar189._8_4_ = iVar97 + iVar88 >> 10;
  auVar189._12_4_ = iVar98 + iVar90 >> 10;
  auVar189 = packssdw(auVar188,auVar189);
  auVar99._0_4_ = iVar115 - iVar144 >> 10;
  auVar99._4_4_ = iVar119 - iVar150 >> 10;
  auVar99._8_4_ = iVar141 - iVar151 >> 10;
  auVar99._12_4_ = iVar142 - iVar152 >> 10;
  auVar155._0_4_ = iVar77 - iVar91 >> 10;
  auVar155._4_4_ = iVar80 - iVar95 >> 10;
  auVar155._8_4_ = iVar88 - iVar97 >> 10;
  auVar155._12_4_ = iVar90 - iVar98 >> 10;
  auVar100 = packssdw(auVar99,auVar155);
  iVar77 = (iVar105 - auVar177._0_4_) + 0x200;
  iVar80 = (iVar117 - auVar177._4_4_) + 0x200;
  iVar88 = (iVar137 - auVar177._8_4_) + 0x200;
  iVar90 = 0x200 - auVar177._12_4_;
  iVar74 = (iVar74 - auVar146._0_4_) + 0x200;
  iVar79 = (iVar79 - auVar146._4_4_) + 0x200;
  iVar85 = (iVar85 - auVar146._8_4_) + 0x200;
  iVar89 = (iVar89 - auVar146._12_4_) + 0x200;
  auVar147._0_4_ = iVar120 + iVar77 >> 10;
  auVar147._4_4_ = iVar127 + iVar80 >> 10;
  auVar147._8_4_ = iVar129 + iVar88 >> 10;
  auVar147._12_4_ = iVar131 + iVar90 >> 10;
  auVar177._0_4_ = iVar121 + iVar74 >> 10;
  auVar177._4_4_ = iVar128 + iVar79 >> 10;
  auVar177._8_4_ = iVar130 + iVar85 >> 10;
  auVar177._12_4_ = iVar132 + iVar89 >> 10;
  auVar148 = packssdw(auVar147,auVar177);
  auVar138._0_4_ = iVar77 - iVar120 >> 10;
  auVar138._4_4_ = iVar80 - iVar127 >> 10;
  auVar138._8_4_ = iVar88 - iVar129 >> 10;
  auVar138._12_4_ = iVar90 - iVar131 >> 10;
  auVar165._0_4_ = iVar74 - iVar121 >> 10;
  auVar165._4_4_ = iVar79 - iVar128 >> 10;
  auVar165._8_4_ = iVar85 - iVar130 >> 10;
  auVar165._12_4_ = iVar89 - iVar132 >> 10;
  auVar139 = packssdw(auVar138,auVar165);
  iVar85 = (iVar73 - auVar122._0_4_) + 0x200;
  iVar88 = (iVar76 - auVar122._4_4_) + 0x200;
  iVar89 = (iVar78 - auVar122._8_4_) + 0x200;
  iVar90 = 0x200 - auVar122._12_4_;
  iVar74 = (iVar104 - auVar187._0_4_) + 0x200;
  iVar77 = (iVar114 - auVar187._4_4_) + 0x200;
  iVar79 = (iVar116 - auVar187._8_4_) + 0x200;
  iVar80 = (iVar118 - auVar187._12_4_) + 0x200;
  auVar86._0_4_ = iVar172 + iVar85 >> 10;
  auVar86._4_4_ = iVar181 + iVar88 >> 10;
  auVar86._8_4_ = iVar183 + iVar89 >> 10;
  auVar86._12_4_ = iVar184 + iVar90 >> 10;
  auVar187._0_4_ = iVar81 + iVar74 >> 10;
  auVar187._4_4_ = iVar82 + iVar77 >> 10;
  auVar187._8_4_ = iVar83 + iVar79 >> 10;
  auVar187._12_4_ = iVar84 + iVar80 >> 10;
  auVar87 = packssdw(auVar86,auVar187);
  auVar123._0_4_ = iVar85 - iVar172 >> 10;
  auVar123._4_4_ = iVar88 - iVar181 >> 10;
  auVar123._8_4_ = iVar89 - iVar183 >> 10;
  auVar123._12_4_ = iVar90 - iVar184 >> 10;
  auVar163._0_4_ = iVar74 - iVar81 >> 10;
  auVar163._4_4_ = iVar77 - iVar82 >> 10;
  auVar163._8_4_ = iVar79 - iVar83 >> 10;
  auVar163._12_4_ = iVar80 - iVar84 >> 10;
  auVar124 = packssdw(auVar123,auVar163);
  uVar103 = auVar100._4_2_;
  sVar96 = auVar87._10_2_;
  sVar182 = auVar87._14_2_;
  auVar146._2_8_ =
       (long)(CONCAT64(CONCAT42(CONCAT22(auVar75._4_2_,uVar103),auVar139._4_2_),
                       CONCAT22(auVar124._4_2_,uVar103)) >> 0x10);
  auVar146._0_2_ = auVar87._4_2_;
  auVar146._10_6_ = 0;
  auVar122._12_4_ = 0;
  auVar122._0_12_ = SUB1612(auVar146 << 0x30,4);
  auVar122 = auVar122 << 0x20;
  auVar169._0_12_ = auVar122._0_12_;
  auVar169._12_2_ = auVar87._4_2_;
  auVar169._14_2_ = auVar87._12_2_;
  auVar168._12_4_ = auVar169._12_4_;
  auVar168._0_10_ = auVar122._0_10_;
  auVar168._10_2_ = auVar148._12_2_;
  auVar167._10_6_ = auVar168._10_6_;
  auVar167._0_8_ = auVar122._0_8_;
  auVar167._8_2_ = auVar148._4_2_;
  auVar166._8_8_ = auVar167._8_8_;
  auVar166._6_2_ = auVar189._12_2_;
  auVar166._4_2_ = auVar189._4_2_;
  auVar166._2_2_ = auVar179._12_2_;
  auVar166._0_2_ = auVar179._4_2_;
  auVar93._2_2_ = auVar124._12_2_;
  auVar93._0_2_ = auVar124._4_2_;
  auVar93._4_2_ = auVar139._4_2_;
  auVar93._6_2_ = auVar139._12_2_;
  auVar93._8_2_ = uVar103;
  auVar93._10_2_ = auVar100._12_2_;
  auVar93._12_2_ = auVar75._4_2_;
  auVar93._14_2_ = auVar75._12_2_;
  auVar109 = pmaddwd(auVar166,_DAT_001b8500);
  auVar177 = pmaddwd(_DAT_001b8500,auVar93);
  auVar170 = pmaddwd(auVar166,_DAT_001b8510);
  auVar187 = pmaddwd(auVar93,_DAT_001b8510);
  auVar68._10_2_ = auVar148._0_2_ + auVar148._8_2_;
  auVar68._0_10_ = (unkuint10)0;
  uVar64 = CONCAT24(auVar139._0_2_ + auVar139._8_2_,(uint)(ushort)(auVar124._0_2_ + auVar124._8_2_))
  ;
  auVar185._0_10_ = (unkuint10)uVar64 << 0x10;
  auVar185._10_2_ = auVar100._0_2_ + auVar100._8_2_;
  auVar190._12_2_ = 0;
  auVar190._0_12_ = auVar185;
  auVar190._14_2_ = auVar75._0_2_ + auVar75._8_2_;
  auVar69._10_2_ = auVar148._0_2_ - auVar148._8_2_;
  auVar69._0_10_ = (unkuint10)0;
  uVar65 = CONCAT24(auVar139._0_2_ - auVar139._8_2_,(uint)(ushort)(auVar124._0_2_ - auVar124._8_2_))
  ;
  auVar153._0_10_ = (unkuint10)uVar65 << 0x10;
  auVar153._10_2_ = auVar100._0_2_ - auVar100._8_2_;
  auVar156._12_2_ = 0;
  auVar156._0_12_ = auVar153;
  auVar156._14_2_ = auVar75._0_2_ - auVar75._8_2_;
  auVar111._8_8_ =
       (undefined8)
       (CONCAT64(CONCAT42(CONCAT22(auVar87._6_2_,sVar182),auVar148._6_2_),
                 CONCAT22(auVar148._14_2_,sVar182)) >> 0x10);
  auVar111._6_2_ = auVar189._6_2_;
  auVar111._4_2_ = auVar189._14_2_;
  auVar111._2_2_ = auVar179._6_2_;
  auVar111._0_2_ = auVar179._14_2_;
  auVar162._2_2_ = auVar124._6_2_;
  auVar162._0_2_ = auVar124._14_2_;
  auVar162._4_2_ = auVar139._14_2_;
  auVar162._6_2_ = auVar139._6_2_;
  auVar162._8_2_ = auVar100._14_2_;
  auVar162._10_2_ = auVar100._6_2_;
  auVar162._12_2_ = auVar75._14_2_;
  auVar162._14_2_ = auVar75._6_2_;
  auVar110 = pmaddwd(auVar111,_DAT_001b8520);
  auVar122 = pmaddwd(_DAT_001b8520,auVar162);
  auVar155 = pmaddwd(auVar111,_DAT_001b8530);
  auVar163 = pmaddwd(auVar162,_DAT_001b8530);
  auVar101._8_8_ =
       (undefined8)
       (CONCAT64(CONCAT42(CONCAT22(auVar87._2_2_,sVar96),auVar148._2_2_),
                 CONCAT22(auVar148._10_2_,sVar96)) >> 0x10);
  auVar101._6_2_ = auVar189._2_2_;
  auVar101._4_2_ = auVar189._10_2_;
  auVar101._2_2_ = auVar179._2_2_;
  auVar101._0_2_ = auVar179._10_2_;
  auVar135._2_2_ = auVar124._2_2_;
  auVar135._0_2_ = auVar124._10_2_;
  auVar135._4_2_ = auVar139._10_2_;
  auVar135._6_2_ = auVar139._2_2_;
  auVar135._8_2_ = auVar100._10_2_;
  auVar135._10_2_ = auVar100._2_2_;
  auVar135._12_2_ = auVar75._10_2_;
  auVar135._14_2_ = auVar75._2_2_;
  auVar140 = pmaddwd(auVar101,_DAT_001b8540);
  auVar111 = pmaddwd(_DAT_001b8540,auVar135);
  auVar146 = pmaddwd(auVar101,_DAT_001b8550);
  auVar136 = pmaddwd(auVar135,_DAT_001b8550);
  sVar182 = sVar182 + auVar87._2_2_;
  auVar125._8_8_ =
       (undefined8)
       (CONCAT64(CONCAT42(CONCAT22(auVar87._6_2_ + sVar96,sVar182),auVar148._6_2_ + auVar148._10_2_)
                 ,CONCAT22(auVar148._14_2_ + auVar148._2_2_,sVar182)) >> 0x10);
  auVar125._6_2_ = auVar189._6_2_ + auVar189._10_2_;
  auVar125._4_2_ = auVar189._14_2_ + auVar189._2_2_;
  auVar125._2_2_ = auVar179._6_2_ + auVar179._10_2_;
  auVar125._0_2_ = auVar179._14_2_ + auVar179._2_2_;
  auVar180._2_2_ = auVar124._6_2_ + auVar124._10_2_;
  auVar180._0_2_ = auVar124._14_2_ + auVar124._2_2_;
  auVar180._4_2_ = auVar139._14_2_ + auVar139._2_2_;
  auVar180._6_2_ = auVar139._6_2_ + auVar139._10_2_;
  auVar180._8_2_ = auVar100._14_2_ + auVar100._2_2_;
  auVar180._10_2_ = auVar100._6_2_ + auVar100._10_2_;
  auVar180._12_2_ = auVar75._14_2_ + auVar75._2_2_;
  auVar180._14_2_ = auVar75._6_2_ + auVar75._10_2_;
  auVar101 = pmaddwd(auVar125,_DAT_001b8560);
  auVar87 = pmaddwd(_DAT_001b8560,auVar180);
  auVar75 = pmaddwd(auVar125,_DAT_001b8570);
  auVar100 = pmaddwd(auVar180,_DAT_001b8570);
  iVar91 = auVar140._0_4_ + auVar75._0_4_;
  iVar95 = auVar140._4_4_ + auVar75._4_4_;
  iVar97 = auVar140._8_4_ + auVar75._8_4_;
  iVar98 = auVar140._12_4_ + auVar75._12_4_;
  iVar81 = auVar75._0_4_ + auVar155._0_4_;
  iVar82 = auVar75._4_4_ + auVar155._4_4_;
  iVar83 = auVar75._8_4_ + auVar155._8_4_;
  iVar84 = auVar75._12_4_ + auVar155._12_4_;
  local_18 = auVar111._0_4_;
  iStack_14 = auVar111._4_4_;
  iStack_10 = auVar111._8_4_;
  iStack_c = auVar111._12_4_;
  local_18 = local_18 + auVar100._0_4_;
  iStack_14 = iStack_14 + auVar100._4_4_;
  iStack_10 = iStack_10 + auVar100._8_4_;
  iStack_c = iStack_c + auVar100._12_4_;
  iVar120 = auVar100._0_4_ + auVar163._0_4_;
  iVar121 = auVar100._4_4_ + auVar163._4_4_;
  iVar127 = auVar100._8_4_ + auVar163._8_4_;
  iVar128 = auVar100._12_4_ + auVar163._12_4_;
  local_58 = auVar110._0_4_;
  iStack_54 = auVar110._4_4_;
  iStack_50 = auVar110._8_4_;
  iStack_4c = auVar110._12_4_;
  local_58 = local_58 + auVar101._0_4_;
  iStack_54 = iStack_54 + auVar101._4_4_;
  iStack_50 = iStack_50 + auVar101._8_4_;
  iStack_4c = iStack_4c + auVar101._12_4_;
  iVar90 = auVar101._0_4_ + auVar146._0_4_;
  iVar73 = auVar101._4_4_ + auVar146._4_4_;
  iVar76 = auVar101._8_4_ + auVar146._8_4_;
  iVar78 = auVar101._12_4_ + auVar146._12_4_;
  local_48 = auVar122._0_4_;
  iStack_44 = auVar122._4_4_;
  iStack_40 = auVar122._8_4_;
  iStack_3c = auVar122._12_4_;
  local_48 = local_48 + auVar87._0_4_;
  iStack_44 = iStack_44 + auVar87._4_4_;
  iStack_40 = iStack_40 + auVar87._8_4_;
  iStack_3c = iStack_3c + auVar87._12_4_;
  iVar74 = auVar87._0_4_ + auVar136._0_4_;
  iVar77 = auVar87._4_4_ + auVar136._4_4_;
  iVar79 = auVar87._8_4_ + auVar136._8_4_;
  iVar80 = auVar87._12_4_ + auVar136._12_4_;
  iVar105 = (int)((uint)(ushort)(auVar179._0_2_ + auVar179._8_2_) << 0x10) >> 4;
  iVar117 = SUB164(ZEXT616(CONCAT42(auVar68._8_4_,auVar189._0_2_ + auVar189._8_2_)) << 0x30,4) >> 4;
  iVar137 = auVar68._8_4_ >> 4;
  iVar115 = iVar105 + 0x1010000 + auVar170._0_4_;
  iVar119 = iVar117 + 0x1010000 + auVar170._4_4_;
  iVar141 = iVar137 + 0x1010000 + auVar170._8_4_;
  iVar142 = auVar170._12_4_ + 0x1010000;
  iVar129 = (int)auVar185._0_10_ >> 4;
  iVar131 = (int)((int6)uVar64 >> 0x14);
  iVar143 = auVar185._8_4_ >> 4;
  iVar150 = auVar190._12_4_ >> 4;
  iVar130 = iVar129 + 0x1010000 + auVar187._0_4_;
  iVar132 = iVar131 + 0x1010000 + auVar187._4_4_;
  iVar144 = iVar143 + 0x1010000 + auVar187._8_4_;
  iVar151 = iVar150 + 0x1010000 + auVar187._12_4_;
  auVar94._0_4_ = iVar90 + iVar115 >> 0x11;
  auVar94._4_4_ = iVar73 + iVar119 >> 0x11;
  auVar94._8_4_ = iVar76 + iVar141 >> 0x11;
  auVar94._12_4_ = iVar78 + iVar142 >> 0x11;
  auVar110._0_4_ = iVar74 + iVar130 >> 0x11;
  auVar110._4_4_ = iVar77 + iVar132 >> 0x11;
  auVar110._8_4_ = iVar79 + iVar144 >> 0x11;
  auVar110._12_4_ = iVar80 + iVar151 >> 0x11;
  auVar101 = packssdw(auVar94,auVar110);
  iVar85 = (int)((uint)(ushort)(auVar179._0_2_ - auVar179._8_2_) << 0x10) >> 4;
  iVar88 = SUB164(ZEXT616(CONCAT42(auVar69._8_4_,auVar189._0_2_ - auVar189._8_2_)) << 0x30,4) >> 4;
  iVar89 = auVar69._8_4_ >> 4;
  iVar104 = (int)auVar153._0_10_ >> 4;
  iVar114 = (int)((int6)uVar65 >> 0x14);
  iVar116 = auVar153._8_4_ >> 4;
  iVar118 = auVar156._12_4_ >> 4;
  auVar149._0_4_ = iVar115 - iVar90 >> 0x11;
  auVar149._4_4_ = iVar119 - iVar73 >> 0x11;
  auVar149._8_4_ = iVar141 - iVar76 >> 0x11;
  auVar149._12_4_ = iVar142 - iVar78 >> 0x11;
  auVar191._0_4_ = iVar130 - iVar74 >> 0x11;
  auVar191._4_4_ = iVar132 - iVar77 >> 0x11;
  auVar191._8_4_ = iVar144 - iVar79 >> 0x11;
  auVar191._12_4_ = iVar151 - iVar80 >> 0x11;
  auVar111 = packssdw(auVar149,auVar191);
  local_38 = auVar109._0_4_;
  iStack_34 = auVar109._4_4_;
  iStack_30 = auVar109._8_4_;
  iStack_2c = auVar109._12_4_;
  iVar74 = iVar85 + 0x1010000 + local_38;
  iVar77 = iVar88 + 0x1010000 + iStack_34;
  iVar79 = iVar89 + 0x1010000 + iStack_30;
  local_28 = auVar177._0_4_;
  iStack_24 = auVar177._4_4_;
  iStack_20 = auVar177._8_4_;
  iStack_1c = auVar177._12_4_;
  iVar80 = iVar104 + 0x1010000 + local_28;
  iVar90 = iVar114 + 0x1010000 + iStack_24;
  iVar73 = iVar116 + 0x1010000 + iStack_20;
  iVar76 = iVar118 + 0x1010000 + iStack_1c;
  auVar109._0_4_ = iVar81 + iVar74 >> 0x11;
  auVar109._4_4_ = iVar82 + iVar77 >> 0x11;
  auVar109._8_4_ = iVar83 + iVar79 >> 0x11;
  auVar109._12_4_ = iVar84 + iStack_2c + 0x1010000 >> 0x11;
  auVar126._0_4_ = iVar120 + iVar80 >> 0x11;
  auVar126._4_4_ = iVar121 + iVar90 >> 0x11;
  auVar126._8_4_ = iVar127 + iVar73 >> 0x11;
  auVar126._12_4_ = iVar128 + iVar76 >> 0x11;
  auVar146 = packssdw(auVar109,auVar126);
  sVar96 = auVar101._0_2_;
  sVar4 = auVar101._2_2_;
  sVar8 = auVar101._4_2_;
  sVar12 = auVar101._6_2_;
  sVar16 = auVar101._8_2_;
  sVar20 = auVar101._10_2_;
  sVar24 = auVar101._12_2_;
  sVar28 = auVar101._14_2_;
  sVar32 = auVar146._0_2_;
  sVar36 = auVar146._2_2_;
  sVar40 = auVar146._4_2_;
  sVar44 = auVar146._6_2_;
  sVar48 = auVar146._8_2_;
  sVar52 = auVar146._10_2_;
  sVar56 = auVar146._12_2_;
  sVar60 = auVar146._14_2_;
  auVar179._0_4_ = iVar74 - iVar81 >> 0x11;
  auVar179._4_4_ = iVar77 - iVar82 >> 0x11;
  auVar179._8_4_ = iVar79 - iVar83 >> 0x11;
  auVar179._12_4_ = (iStack_2c + 0x1010000) - iVar84 >> 0x11;
  auVar157._0_4_ = iVar80 - iVar120 >> 0x11;
  auVar157._4_4_ = iVar90 - iVar121 >> 0x11;
  auVar157._8_4_ = iVar73 - iVar127 >> 0x11;
  auVar157._12_4_ = iVar76 - iVar128 >> 0x11;
  auVar177 = packssdw(auVar179,auVar157);
  sVar182 = auVar177._0_2_;
  sVar5 = auVar177._2_2_;
  sVar9 = auVar177._4_2_;
  sVar13 = auVar177._6_2_;
  sVar17 = auVar177._8_2_;
  sVar21 = auVar177._10_2_;
  sVar25 = auVar177._12_2_;
  sVar29 = auVar177._14_2_;
  sVar33 = auVar111._0_2_;
  sVar37 = auVar111._2_2_;
  sVar41 = auVar111._4_2_;
  sVar45 = auVar111._6_2_;
  sVar49 = auVar111._8_2_;
  sVar53 = auVar111._10_2_;
  sVar57 = auVar111._12_2_;
  sVar61 = auVar111._14_2_;
  iVar74 = (iVar85 - local_38) + 0x1010000;
  iVar77 = (iVar88 - iStack_34) + 0x1010000;
  iVar79 = (iVar89 - iStack_30) + 0x1010000;
  iVar80 = (iVar104 - local_28) + 0x1010000;
  iVar85 = (iVar114 - iStack_24) + 0x1010000;
  iVar88 = (iVar116 - iStack_20) + 0x1010000;
  iVar89 = (iVar118 - iStack_1c) + 0x1010000;
  auVar124._0_4_ = iVar91 + iVar74 >> 0x11;
  auVar124._4_4_ = iVar95 + iVar77 >> 0x11;
  auVar124._8_4_ = iVar97 + iVar79 >> 0x11;
  auVar124._12_4_ = iVar98 + (0x1010000 - iStack_2c) >> 0x11;
  auVar112._0_4_ = local_18 + iVar80 >> 0x11;
  auVar112._4_4_ = iStack_14 + iVar85 >> 0x11;
  auVar112._8_4_ = iStack_10 + iVar88 >> 0x11;
  auVar112._12_4_ = iStack_c + iVar89 >> 0x11;
  auVar155 = packssdw(auVar124,auVar112);
  auVar102._0_4_ = iVar74 - iVar91 >> 0x11;
  auVar102._4_4_ = iVar77 - iVar95 >> 0x11;
  auVar102._8_4_ = iVar79 - iVar97 >> 0x11;
  auVar102._12_4_ = (0x1010000 - iStack_2c) - iVar98 >> 0x11;
  auVar171._0_4_ = iVar80 - local_18 >> 0x11;
  auVar171._4_4_ = iVar85 - iStack_14 >> 0x11;
  auVar171._8_4_ = iVar88 - iStack_10 >> 0x11;
  auVar171._12_4_ = iVar89 - iStack_c >> 0x11;
  auVar100 = packssdw(auVar102,auVar171);
  iVar74 = (iVar105 - auVar170._0_4_) + 0x1010000;
  iVar77 = (iVar117 - auVar170._4_4_) + 0x1010000;
  iVar79 = (iVar137 - auVar170._8_4_) + 0x1010000;
  iVar80 = 0x1010000 - auVar170._12_4_;
  iVar85 = (iVar129 - auVar187._0_4_) + 0x1010000;
  iVar88 = (iVar131 - auVar187._4_4_) + 0x1010000;
  iVar89 = (iVar143 - auVar187._8_4_) + 0x1010000;
  iVar90 = (iVar150 - auVar187._12_4_) + 0x1010000;
  auVar170._0_4_ = local_58 + iVar74 >> 0x11;
  auVar170._4_4_ = iStack_54 + iVar77 >> 0x11;
  auVar170._8_4_ = iStack_50 + iVar79 >> 0x11;
  auVar170._12_4_ = iStack_4c + iVar80 >> 0x11;
  auVar113._0_4_ = local_48 + iVar85 >> 0x11;
  auVar113._4_4_ = iStack_44 + iVar88 >> 0x11;
  auVar113._8_4_ = iStack_40 + iVar89 >> 0x11;
  auVar113._12_4_ = iStack_3c + iVar90 >> 0x11;
  auVar87 = packssdw(auVar170,auVar113);
  sVar2 = auVar155._0_2_;
  sVar6 = auVar155._2_2_;
  sVar10 = auVar155._4_2_;
  sVar14 = auVar155._6_2_;
  sVar18 = auVar155._8_2_;
  sVar22 = auVar155._10_2_;
  sVar26 = auVar155._12_2_;
  sVar30 = auVar155._14_2_;
  sVar34 = auVar87._0_2_;
  sVar38 = auVar87._2_2_;
  sVar42 = auVar87._4_2_;
  sVar46 = auVar87._6_2_;
  sVar50 = auVar87._8_2_;
  sVar54 = auVar87._10_2_;
  sVar58 = auVar87._12_2_;
  sVar62 = auVar87._14_2_;
  auVar75._0_4_ = iVar74 - local_58 >> 0x11;
  auVar75._4_4_ = iVar77 - iStack_54 >> 0x11;
  auVar75._8_4_ = iVar79 - iStack_50 >> 0x11;
  auVar75._12_4_ = iVar80 - iStack_4c >> 0x11;
  auVar164._0_4_ = iVar85 - local_48 >> 0x11;
  auVar164._4_4_ = iVar88 - iStack_44 >> 0x11;
  auVar164._8_4_ = iVar89 - iStack_40 >> 0x11;
  auVar164._12_4_ = iVar90 - iStack_3c >> 0x11;
  auVar122 = packssdw(auVar75,auVar164);
  sVar3 = auVar122._0_2_;
  sVar7 = auVar122._2_2_;
  sVar11 = auVar122._4_2_;
  sVar15 = auVar122._6_2_;
  sVar19 = auVar122._8_2_;
  sVar23 = auVar122._10_2_;
  sVar27 = auVar122._12_2_;
  sVar31 = auVar122._14_2_;
  sVar35 = auVar100._0_2_;
  sVar39 = auVar100._2_2_;
  sVar43 = auVar100._4_2_;
  sVar47 = auVar100._6_2_;
  sVar51 = auVar100._8_2_;
  sVar55 = auVar100._10_2_;
  sVar59 = auVar100._12_2_;
  sVar63 = auVar100._14_2_;
  *out = (0 < sVar96) * (sVar96 < 0x100) * auVar101[0] - (0xff < sVar96);
  out[1] = (0 < sVar32) * (sVar32 < 0x100) * auVar146[0] - (0xff < sVar32);
  out[2] = (0 < sVar2) * (sVar2 < 0x100) * auVar155[0] - (0xff < sVar2);
  out[3] = (0 < sVar34) * (sVar34 < 0x100) * auVar87[0] - (0xff < sVar34);
  out[4] = (0 < sVar3) * (sVar3 < 0x100) * auVar122[0] - (0xff < sVar3);
  out[5] = (0 < sVar35) * (sVar35 < 0x100) * auVar100[0] - (0xff < sVar35);
  out[6] = (0 < sVar182) * (sVar182 < 0x100) * auVar177[0] - (0xff < sVar182);
  out[7] = (0 < sVar33) * (sVar33 < 0x100) * auVar111[0] - (0xff < sVar33);
  lVar71 = (long)out_stride;
  out[lVar71 + 8] = (0 < sVar4) * (sVar4 < 0x100) * auVar101[2] - (0xff < sVar4);
  out[lVar71 + 9] = (0 < sVar36) * (sVar36 < 0x100) * auVar146[2] - (0xff < sVar36);
  out[lVar71 + 10] = (0 < sVar6) * (sVar6 < 0x100) * auVar155[2] - (0xff < sVar6);
  out[lVar71 + 0xb] = (0 < sVar38) * (sVar38 < 0x100) * auVar87[2] - (0xff < sVar38);
  out[lVar71 + 0xc] = (0 < sVar7) * (sVar7 < 0x100) * auVar122[2] - (0xff < sVar7);
  out[lVar71 + 0xd] = (0 < sVar39) * (sVar39 < 0x100) * auVar100[2] - (0xff < sVar39);
  out[lVar71 + 0xe] = (0 < sVar5) * (sVar5 < 0x100) * auVar177[2] - (0xff < sVar5);
  out[lVar71 + 0xf] = (0 < sVar37) * (sVar37 < 0x100) * auVar111[2] - (0xff < sVar37);
  psVar1 = out + lVar71 * 2;
  *psVar1 = (0 < sVar8) * (sVar8 < 0x100) * auVar101[4] - (0xff < sVar8);
  psVar1[1] = (0 < sVar40) * (sVar40 < 0x100) * auVar146[4] - (0xff < sVar40);
  psVar1[2] = (0 < sVar10) * (sVar10 < 0x100) * auVar155[4] - (0xff < sVar10);
  psVar1[3] = (0 < sVar42) * (sVar42 < 0x100) * auVar87[4] - (0xff < sVar42);
  psVar1[4] = (0 < sVar11) * (sVar11 < 0x100) * auVar122[4] - (0xff < sVar11);
  psVar1[5] = (0 < sVar43) * (sVar43 < 0x100) * auVar100[4] - (0xff < sVar43);
  psVar1[6] = (0 < sVar9) * (sVar9 < 0x100) * auVar177[4] - (0xff < sVar9);
  psVar1[7] = (0 < sVar41) * (sVar41 < 0x100) * auVar111[4] - (0xff < sVar41);
  lVar70 = lVar71 * 3;
  out[lVar70 + 8] = (0 < sVar12) * (sVar12 < 0x100) * auVar101[6] - (0xff < sVar12);
  out[lVar70 + 9] = (0 < sVar44) * (sVar44 < 0x100) * auVar146[6] - (0xff < sVar44);
  out[lVar70 + 10] = (0 < sVar14) * (sVar14 < 0x100) * auVar155[6] - (0xff < sVar14);
  out[lVar70 + 0xb] = (0 < sVar46) * (sVar46 < 0x100) * auVar87[6] - (0xff < sVar46);
  out[lVar70 + 0xc] = (0 < sVar15) * (sVar15 < 0x100) * auVar122[6] - (0xff < sVar15);
  out[lVar70 + 0xd] = (0 < sVar47) * (sVar47 < 0x100) * auVar100[6] - (0xff < sVar47);
  out[lVar70 + 0xe] = (0 < sVar13) * (sVar13 < 0x100) * auVar177[6] - (0xff < sVar13);
  out[lVar70 + 0xf] = (0 < sVar45) * (sVar45 < 0x100) * auVar111[6] - (0xff < sVar45);
  psVar1 = out + lVar71 * 4;
  *psVar1 = (0 < sVar16) * (sVar16 < 0x100) * auVar101[8] - (0xff < sVar16);
  psVar1[1] = (0 < sVar48) * (sVar48 < 0x100) * auVar146[8] - (0xff < sVar48);
  psVar1[2] = (0 < sVar18) * (sVar18 < 0x100) * auVar155[8] - (0xff < sVar18);
  psVar1[3] = (0 < sVar50) * (sVar50 < 0x100) * auVar87[8] - (0xff < sVar50);
  psVar1[4] = (0 < sVar19) * (sVar19 < 0x100) * auVar122[8] - (0xff < sVar19);
  psVar1[5] = (0 < sVar51) * (sVar51 < 0x100) * auVar100[8] - (0xff < sVar51);
  psVar1[6] = (0 < sVar17) * (sVar17 < 0x100) * auVar177[8] - (0xff < sVar17);
  psVar1[7] = (0 < sVar49) * (sVar49 < 0x100) * auVar111[8] - (0xff < sVar49);
  lVar70 = lVar71 * 5;
  out[lVar70 + 8] = (0 < sVar20) * (sVar20 < 0x100) * auVar101[10] - (0xff < sVar20);
  out[lVar70 + 9] = (0 < sVar52) * (sVar52 < 0x100) * auVar146[10] - (0xff < sVar52);
  out[lVar70 + 10] = (0 < sVar22) * (sVar22 < 0x100) * auVar155[10] - (0xff < sVar22);
  out[lVar70 + 0xb] = (0 < sVar54) * (sVar54 < 0x100) * auVar87[10] - (0xff < sVar54);
  out[lVar70 + 0xc] = (0 < sVar23) * (sVar23 < 0x100) * auVar122[10] - (0xff < sVar23);
  out[lVar70 + 0xd] = (0 < sVar55) * (sVar55 < 0x100) * auVar100[10] - (0xff < sVar55);
  out[lVar70 + 0xe] = (0 < sVar21) * (sVar21 < 0x100) * auVar177[10] - (0xff < sVar21);
  out[lVar70 + 0xf] = (0 < sVar53) * (sVar53 < 0x100) * auVar111[10] - (0xff < sVar53);
  psVar1 = out + lVar71 * 6;
  *psVar1 = (0 < sVar24) * (sVar24 < 0x100) * auVar101[0xc] - (0xff < sVar24);
  psVar1[1] = (0 < sVar56) * (sVar56 < 0x100) * auVar146[0xc] - (0xff < sVar56);
  psVar1[2] = (0 < sVar26) * (sVar26 < 0x100) * auVar155[0xc] - (0xff < sVar26);
  psVar1[3] = (0 < sVar58) * (sVar58 < 0x100) * auVar87[0xc] - (0xff < sVar58);
  psVar1[4] = (0 < sVar27) * (sVar27 < 0x100) * auVar122[0xc] - (0xff < sVar27);
  psVar1[5] = (0 < sVar59) * (sVar59 < 0x100) * auVar100[0xc] - (0xff < sVar59);
  psVar1[6] = (0 < sVar25) * (sVar25 < 0x100) * auVar177[0xc] - (0xff < sVar25);
  psVar1[7] = (0 < sVar57) * (sVar57 < 0x100) * auVar111[0xc] - (0xff < sVar57);
  lVar71 = lVar71 * 7;
  out[lVar71 + 8] = (0 < sVar28) * (sVar28 < 0x100) * auVar101[0xe] - (0xff < sVar28);
  out[lVar71 + 9] = (0 < sVar60) * (sVar60 < 0x100) * auVar146[0xe] - (0xff < sVar60);
  out[lVar71 + 10] = (0 < sVar30) * (sVar30 < 0x100) * auVar155[0xe] - (0xff < sVar30);
  out[lVar71 + 0xb] = (0 < sVar62) * (sVar62 < 0x100) * auVar87[0xe] - (0xff < sVar62);
  out[lVar71 + 0xc] = (0 < sVar31) * (sVar31 < 0x100) * auVar122[0xe] - (0xff < sVar31);
  out[lVar71 + 0xd] = (0 < sVar63) * (sVar63 < 0x100) * auVar100[0xe] - (0xff < sVar63);
  out[lVar71 + 0xe] = (0 < sVar29) * (sVar29 < 0x100) * auVar177[0xe] - (0xff < sVar29);
  out[lVar71 + 0xf] = (0 < sVar61) * (sVar61 < 0x100) * auVar111[0xe] - (0xff < sVar61);
  return;
}

Assistant:

static void stbi__idct_simd(stbi_uc *out, int out_stride, short data[64])
{
   // This is constructed to match our regular (generic) integer IDCT exactly.
   __m128i row0, row1, row2, row3, row4, row5, row6, row7;
   __m128i tmp;

   // dot product constant: even elems=x, odd elems=y
   #define dct_const(x,y)  _mm_setr_epi16((x),(y),(x),(y),(x),(y),(x),(y))

   // out(0) = c0[even]*x + c0[odd]*y   (c0, x, y 16-bit, out 32-bit)
   // out(1) = c1[even]*x + c1[odd]*y
   #define dct_rot(out0,out1, x,y,c0,c1) \
      __m128i c0##lo = _mm_unpacklo_epi16((x),(y)); \
      __m128i c0##hi = _mm_unpackhi_epi16((x),(y)); \
      __m128i out0##_l = _mm_madd_epi16(c0##lo, c0); \
      __m128i out0##_h = _mm_madd_epi16(c0##hi, c0); \
      __m128i out1##_l = _mm_madd_epi16(c0##lo, c1); \
      __m128i out1##_h = _mm_madd_epi16(c0##hi, c1)

   // out = in << 12  (in 16-bit, out 32-bit)
   #define dct_widen(out, in) \
      __m128i out##_l = _mm_srai_epi32(_mm_unpacklo_epi16(_mm_setzero_si128(), (in)), 4); \
      __m128i out##_h = _mm_srai_epi32(_mm_unpackhi_epi16(_mm_setzero_si128(), (in)), 4)

   // wide add
   #define dct_wadd(out, a, b) \
      __m128i out##_l = _mm_add_epi32(a##_l, b##_l); \
      __m128i out##_h = _mm_add_epi32(a##_h, b##_h)

   // wide sub
   #define dct_wsub(out, a, b) \
      __m128i out##_l = _mm_sub_epi32(a##_l, b##_l); \
      __m128i out##_h = _mm_sub_epi32(a##_h, b##_h)

   // butterfly a/b, add bias, then shift by "s" and pack
   #define dct_bfly32o(out0, out1, a,b,bias,s) \
      { \
         __m128i abiased_l = _mm_add_epi32(a##_l, bias); \
         __m128i abiased_h = _mm_add_epi32(a##_h, bias); \
         dct_wadd(sum, abiased, b); \
         dct_wsub(dif, abiased, b); \
         out0 = _mm_packs_epi32(_mm_srai_epi32(sum_l, s), _mm_srai_epi32(sum_h, s)); \
         out1 = _mm_packs_epi32(_mm_srai_epi32(dif_l, s), _mm_srai_epi32(dif_h, s)); \
      }

   // 8-bit interleave step (for transposes)
   #define dct_interleave8(a, b) \
      tmp = a; \
      a = _mm_unpacklo_epi8(a, b); \
      b = _mm_unpackhi_epi8(tmp, b)

   // 16-bit interleave step (for transposes)
   #define dct_interleave16(a, b) \
      tmp = a; \
      a = _mm_unpacklo_epi16(a, b); \
      b = _mm_unpackhi_epi16(tmp, b)

   #define dct_pass(bias,shift) \
      { \
         /* even part */ \
         dct_rot(t2e,t3e, row2,row6, rot0_0,rot0_1); \
         __m128i sum04 = _mm_add_epi16(row0, row4); \
         __m128i dif04 = _mm_sub_epi16(row0, row4); \
         dct_widen(t0e, sum04); \
         dct_widen(t1e, dif04); \
         dct_wadd(x0, t0e, t3e); \
         dct_wsub(x3, t0e, t3e); \
         dct_wadd(x1, t1e, t2e); \
         dct_wsub(x2, t1e, t2e); \
         /* odd part */ \
         dct_rot(y0o,y2o, row7,row3, rot2_0,rot2_1); \
         dct_rot(y1o,y3o, row5,row1, rot3_0,rot3_1); \
         __m128i sum17 = _mm_add_epi16(row1, row7); \
         __m128i sum35 = _mm_add_epi16(row3, row5); \
         dct_rot(y4o,y5o, sum17,sum35, rot1_0,rot1_1); \
         dct_wadd(x4, y0o, y4o); \
         dct_wadd(x5, y1o, y5o); \
         dct_wadd(x6, y2o, y5o); \
         dct_wadd(x7, y3o, y4o); \
         dct_bfly32o(row0,row7, x0,x7,bias,shift); \
         dct_bfly32o(row1,row6, x1,x6,bias,shift); \
         dct_bfly32o(row2,row5, x2,x5,bias,shift); \
         dct_bfly32o(row3,row4, x3,x4,bias,shift); \
      }